

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_nullddi.cpp
# Opt level: O0

ze_result_t driver::zeMemCloseIpcHandle(ze_context_handle_t hContext,void *ptr)

{
  ze_pfnMemCloseIpcHandle_t pfnCloseIpcHandle;
  ze_result_t result;
  void *ptr_local;
  ze_context_handle_t hContext_local;
  
  pfnCloseIpcHandle._4_4_ = ZE_RESULT_SUCCESS;
  if (DAT_0011c528 != (code *)0x0) {
    pfnCloseIpcHandle._4_4_ = (*DAT_0011c528)(hContext,ptr);
  }
  return pfnCloseIpcHandle._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeMemCloseIpcHandle(
        ze_context_handle_t hContext,                   ///< [in] handle of the context object
        const void* ptr                                 ///< [in][release] pointer to device allocation in this process
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // if the driver has created a custom function, then call it instead of using the generic path
        auto pfnCloseIpcHandle = context.zeDdiTable.Mem.pfnCloseIpcHandle;
        if( nullptr != pfnCloseIpcHandle )
        {
            result = pfnCloseIpcHandle( hContext, ptr );
        }
        else
        {
            // generic implementation
        }

        return result;
    }